

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall Instance::name_abi_cxx11_(Instance *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x38));
  return in_RDI;
}

Assistant:

std::string Instance::name() const {
    return _name;
}